

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

bool __thiscall
qpdf::Tokenizer::nextToken(Tokenizer *this,InputSource *input,string *context,size_t max_len)

{
  bool bVar1;
  qpdf_offset_t offset;
  char ch;
  char local_41;
  string *local_40;
  string *local_38;
  
  if (this->state != st_inline_image) {
    reset(this);
  }
  offset = InputSource::fastTell(input);
  local_40 = &this->error_message;
  local_38 = &this->raw_val;
  while (this->state != st_token_ready) {
    bVar1 = InputSource::fastRead(input,&local_41);
    if (bVar1) {
      handleCharacter(this,local_41);
      bVar1 = this->before_token;
      if (this->in_token == true) {
        std::__cxx11::string::push_back((char)local_38);
      }
      offset = offset + (ulong)bVar1;
      if (((max_len != 0) && (max_len <= (this->raw_val)._M_string_length)) &&
         (this->state != st_token_ready)) {
        this->type = tt_bad;
        this->state = st_token_ready;
        std::__cxx11::string::assign((char *)local_40);
      }
    }
    else {
      presentEOF(this);
      if ((this->type == tt_eof) && (this->allow_eof == false)) {
        this->type = tt_bad;
        std::__cxx11::string::assign((char *)local_40);
        offset = InputSource::getLastOffset(input);
      }
    }
  }
  InputSource::fastUnread(input,(bool)(~(this->before_token | this->in_token) & 1));
  if (this->type != tt_eof) {
    InputSource::setLastOffset(input,offset);
  }
  return (this->error_message)._M_string_length == 0;
}

Assistant:

bool
Tokenizer::nextToken(InputSource& input, std::string const& context, size_t max_len)
{
    if (state != st_inline_image) {
        reset();
    }
    qpdf_offset_t offset = input.fastTell();

    while (state != st_token_ready) {
        char ch;
        if (!input.fastRead(ch)) {
            presentEOF();

            if ((type == tt::tt_eof) && (!allow_eof)) {
                // Nothing in the qpdf library calls readToken without allowEOF anymore, so this
                // case is not exercised.
                type = tt::tt_bad;
                error_message = "unexpected EOF";
                offset = input.getLastOffset();
            }
        } else {
            handleCharacter(ch);
            if (before_token) {
                ++offset;
            }
            if (in_token) {
                raw_val += ch;
            }
            if (max_len && (raw_val.length() >= max_len) && (state != st_token_ready)) {
                // terminate this token now
                QTC::TC("qpdf", "QPDFTokenizer block long token");
                type = tt::tt_bad;
                state = st_token_ready;
                error_message = "exceeded allowable length while reading token";
            }
        }
    }

    input.fastUnread(!in_token && !before_token);

    if (type != tt::tt_eof) {
        input.setLastOffset(offset);
    }

    return error_message.empty();
}